

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_alg.c
# Opt level: O2

void mat_tpose_vec(csc *A,c_float *x,c_float *y,c_int plus_eq,c_int skip_diag)

{
  long lVar1;
  c_int *pcVar2;
  long lVar3;
  long lVar4;
  c_int cVar5;
  long lVar6;
  double dVar7;
  
  lVar1 = A->n;
  if (plus_eq == 0) {
    lVar4 = 0;
    lVar6 = 0;
    if (0 < lVar1) {
      lVar6 = lVar1;
    }
    for (; lVar6 != lVar4; lVar4 = lVar4 + 1) {
      y[lVar4] = 0.0;
    }
  }
  pcVar2 = A->p;
  if (pcVar2[lVar1] != 0) {
    lVar6 = 0;
    if (0 < lVar1) {
      lVar6 = lVar1;
    }
    if (plus_eq == -1) {
      lVar1 = 0;
      if (skip_diag == 0) {
        while (lVar4 = lVar1, lVar4 != lVar6) {
          lVar3 = pcVar2[lVar4 + 1];
          for (cVar5 = pcVar2[lVar4]; lVar1 = lVar4 + 1, cVar5 < lVar3; cVar5 = cVar5 + 1) {
            y[lVar4] = y[lVar4] - A->x[cVar5] * x[A->i[cVar5]];
          }
        }
      }
      else {
        while (lVar4 = lVar1, lVar4 != lVar6) {
          lVar3 = pcVar2[lVar4 + 1];
          for (cVar5 = pcVar2[lVar4]; lVar1 = lVar4 + 1, cVar5 < lVar3; cVar5 = cVar5 + 1) {
            dVar7 = 0.0;
            if (A->i[cVar5] != lVar4) {
              dVar7 = A->x[cVar5] * x[A->i[cVar5]];
            }
            y[lVar4] = y[lVar4] - dVar7;
          }
        }
      }
    }
    else {
      lVar1 = 0;
      if (skip_diag == 0) {
        while (lVar4 = lVar1, lVar4 != lVar6) {
          lVar3 = pcVar2[lVar4 + 1];
          for (cVar5 = pcVar2[lVar4]; lVar1 = lVar4 + 1, cVar5 < lVar3; cVar5 = cVar5 + 1) {
            y[lVar4] = A->x[cVar5] * x[A->i[cVar5]] + y[lVar4];
          }
        }
      }
      else {
        while (lVar4 = lVar1, lVar4 != lVar6) {
          lVar3 = pcVar2[lVar4 + 1];
          for (cVar5 = pcVar2[lVar4]; lVar1 = lVar4 + 1, cVar5 < lVar3; cVar5 = cVar5 + 1) {
            dVar7 = 0.0;
            if (A->i[cVar5] != lVar4) {
              dVar7 = A->x[cVar5] * x[A->i[cVar5]];
            }
            y[lVar4] = dVar7 + y[lVar4];
          }
        }
      }
    }
  }
  return;
}

Assistant:

void mat_tpose_vec(const csc *A, const c_float *x, c_float *y,
                   c_int plus_eq, c_int skip_diag) {
  c_int i, j, k;

  if (!plus_eq) {
    // y = 0
    for (i = 0; i < A->n; i++) {
      y[i] = 0;
    }
  }

  // if A is empty
  if (A->p[A->n] == 0) {
    return;
  }

  if (plus_eq == -1) {
    // y -=  A*x
    if (skip_diag) {
      for (j = 0; j < A->n; j++) {
        for (k = A->p[j]; k < A->p[j + 1]; k++) {
          i     = A->i[k];
          y[j] -= i == j ? 0 : A->x[k] * x[i];
        }
      }
    } else {
      for (j = 0; j < A->n; j++) {
        for (k = A->p[j]; k < A->p[j + 1]; k++) {
          y[j] -= A->x[k] * x[A->i[k]];
        }
      }
    }
  } else {
    // y +=  A*x
    if (skip_diag) {
      for (j = 0; j < A->n; j++) {
        for (k = A->p[j]; k < A->p[j + 1]; k++) {
          i     = A->i[k];
          y[j] += i == j ? 0 : A->x[k] * x[i];
        }
      }
    } else {
      for (j = 0; j < A->n; j++) {
        for (k = A->p[j]; k < A->p[j + 1]; k++) {
          y[j] += A->x[k] * x[A->i[k]];
        }
      }
    }
  }
}